

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-command.c
# Opt level: O2

void do_cmd_redraw(void)

{
  ulong uVar1;
  player_upkeep *ppVar2;
  _Bool _Var3;
  loc_conflict in_RAX;
  loc_conflict target;
  
  target = in_RAX;
  Term_flush();
  event_signal(EVENT_INPUT_FLUSH);
  if (character_dungeon == true) {
    verify_panel();
  }
  Term_xtra(L'\n',L'\0');
  if (character_dungeon == true) {
    ppVar2 = player->upkeep;
    uVar1._0_4_ = ppVar2->notice;
    uVar1._4_4_ = ppVar2->update;
    ppVar2->notice = (int)(uVar1 | 0x27700000001);
    ppVar2->update = (int)((uVar1 | 0x27700000001) >> 0x20);
    ppVar2->redraw = ppVar2->redraw | 0xffbfff;
  }
  Term_clear();
  if (character_dungeon == true) {
    handle_stuff(player);
    if (((character_dungeon == true) && ((player->opts).opt[8] == true)) &&
       (_Var3 = target_sighted(), _Var3)) {
      target_get(&target);
    }
    else {
      target.x = (player->grid).x;
      target.y = (player->grid).y;
    }
    move_cursor_relative(target.y,target.x);
  }
  Term_redraw_all();
  return;
}

Assistant:

void do_cmd_redraw(void)
{
	/* Low level flush */
	Term_flush();

	/* Reset "inkey()" */
	event_signal(EVENT_INPUT_FLUSH);

	if (character_dungeon)
		verify_panel();

	/* Hack -- React to changes */
	Term_xtra(TERM_XTRA_REACT, 0);

	if (character_dungeon) {
		/* Combine the pack (later) */
		player->upkeep->notice |= (PN_COMBINE);

		/* Update torch, gear */
		player->upkeep->update |= (PU_TORCH | PU_INVEN);

		/* Update stuff */
		player->upkeep->update |= (PU_BONUS | PU_HP | PU_SPELLS);

		/* Fully update the visuals */
		player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);

		/* Redraw everything */
		player->upkeep->redraw |= (PR_BASIC | PR_EXTRA | PR_MAP | PR_INVEN |
								   PR_EQUIP | PR_MESSAGE | PR_MONSTER |
								   PR_OBJECT | PR_MONLIST | PR_ITEMLIST);
	}

	/* Clear screen */
	Term_clear();

	if (character_dungeon) {
		/* Hack -- update */
		handle_stuff(player);

		/* Place the cursor on the player */
		if ((0 != character_dungeon) && OPT(player, show_target) &&
			target_sighted()) {
			struct loc target;
			target_get(&target);
			move_cursor_relative(target.y, target.x);
		} else {
			move_cursor_relative(player->grid.y, player->grid.x);
		}
	}

	/* Redraw every window */
	(void) Term_redraw_all();
}